

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

void lyd_diff_insert_sibling(lyd_node *sibling,lyd_node *node,lyd_node **first_sibling)

{
  lyd_node *plVar1;
  
  if ((node != (lyd_node *)0x0) && (first_sibling != (lyd_node **)0x0)) {
    lyd_unlink_ignore_lyds((lyd_node **)0x0,node);
    plVar1 = lyd_first_sibling(sibling);
    *first_sibling = plVar1;
    lyd_insert_node((lyd_node *)0x0,first_sibling,node,2);
    return;
  }
  __assert_fail("node && first_sibling",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                0x12f,
                "void lyd_diff_insert_sibling(struct lyd_node *, struct lyd_node *, struct lyd_node **)"
               );
}

Assistant:

static void
lyd_diff_insert_sibling(struct lyd_node *sibling, struct lyd_node *node, struct lyd_node **first_sibling)
{
    assert(node && first_sibling);

    lyd_unlink_ignore_lyds(NULL, node);
    *first_sibling = lyd_first_sibling(sibling);
    lyd_insert_node(NULL, first_sibling, node, LYD_INSERT_NODE_LAST_BY_SCHEMA);
}